

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::set_root_as_stream(Tree *this)

{
  undefined1 uVar1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  bool bVar5;
  size_t node;
  size_t sVar6;
  size_t node_00;
  size_t sVar7;
  size_t node_01;
  NodeData *pNVar8;
  ulong uVar9;
  long lVar10;
  size_t after;
  ulong uVar11;
  NodeType_e NVar12;
  char msg [31];
  char local_88 [8];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  long local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  node = root_id(this);
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    uStack_80 = 0x4b86;
    uStack_7c = 0;
    local_78 = 0;
    uStack_74 = 0;
    uStack_70 = 0x214288;
    uStack_6c = 0;
    local_68 = 0x65;
    (*(code *)PTR_error_impl_00247a78)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  lVar10 = node * 0x90;
  if ((~(int)this->m_buf[node].m_type.type & 0x28U) == 0) {
    return;
  }
  bVar5 = has_children(this,node);
  uVar9 = this->m_cap;
  if (bVar5) {
    if (uVar9 <= node || node == 0xffffffffffffffff) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_88[0] = '\0';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      uStack_80 = 0x4b86;
      uStack_7c = 0;
      local_78 = 0;
      uStack_74 = 0;
      uStack_70 = 0x214288;
      uStack_6c = 0;
      local_68 = 0x65;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((this->m_buf[node].m_type.type & KEY) != NOTYPE) {
      local_78 = 0x5f736168;
      uStack_74 = 0x2879656b;
      uStack_70 = 0x746f6f72;
      uStack_6c = CONCAT13(uStack_6c._3_1_,0x2929);
      builtin_strncpy(local_88,"check fa",8);
      uStack_80 = 0x64656c69;
      uStack_7c = 0x2128203a;
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_58 = 0;
      uStack_50 = 0x6567;
      local_48 = 0;
      pcStack_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_38 = 0x65;
      auVar4 = ZEXT1224(ZEXT412(0x6567) << 0x40);
      LVar3.name.str._0_4_ = 0x214288;
      LVar3.super_LineCol.offset = auVar4._0_8_;
      LVar3.super_LineCol.line = auVar4._8_8_;
      LVar3.super_LineCol.col = auVar4._16_8_;
      LVar3.name.str._4_4_ = 0;
      LVar3.name.len = 0x65;
      (*(this->m_callbacks).m_error)(local_88,0x1f,LVar3,(this->m_callbacks).m_user_data);
    }
    uVar9 = this->m_cap;
    if (node < uVar9 && node != 0xffffffffffffffff) {
      pNVar8 = this->m_buf;
      uVar11 = pNVar8[node].m_last_child;
LAB_001c8140:
      if (uVar9 <= node) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        uStack_80 = 0x4b86;
        uStack_7c = 0;
        local_78 = 0;
        uStack_74 = 0;
        uStack_70 = 0x214288;
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        pNVar8 = this->m_buf;
      }
      uVar1 = (undefined1)pNVar8[node].m_type.type;
    }
    else {
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_88[0] = '\0';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      uStack_80 = 0x4b83;
      uStack_7c = 0;
      local_78 = 0;
      uStack_74 = 0;
      uStack_70 = 0x214288;
      uStack_6c = 0;
      local_68 = 0x65;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      pNVar8 = this->m_buf;
      uVar11 = pNVar8[node].m_last_child;
      if (node != 0xffffffffffffffff) {
        uVar9 = this->m_cap;
        goto LAB_001c8140;
      }
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_88[0] = '\0';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      uStack_80 = 0x4cb1;
      uStack_7c = 0;
      local_78 = 0;
      uStack_74 = 0;
      uStack_70 = 0x214288;
      uStack_6c = 0;
      local_68 = 0x65;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_88[0] = '\0';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      uStack_80 = 0x4b86;
      uStack_7c = 0;
      local_78 = 0;
      uStack_74 = 0;
      uStack_70 = 0x214288;
      uStack_6c = 0;
      local_68 = 0x65;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      uVar1 = (undefined1)this->m_buf[-1].m_type.type;
    }
    if (((uVar1 & (STREAM|MAP)) == NOTYPE) && (bVar5 = is_root(this,node), !bVar5)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_88[0] = '\0';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      uStack_80 = 0x4cb2;
      uStack_7c = 0;
      local_78 = 0;
      uStack_74 = 0;
      uStack_70 = 0x214288;
      uStack_6c = 0;
      local_68 = 0x65;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: is_container(parent) || is_root(parent)",0x35,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if (uVar11 != 0xffffffffffffffff) {
      if (this->m_cap <= uVar11) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        uStack_80 = 0x4b83;
        uStack_7c = 0;
        local_78 = 0;
        uStack_74 = 0;
        uStack_70 = 0x214288;
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if (this->m_buf[uVar11].m_parent != node) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        uStack_80 = 0x4cb3;
        uStack_7c = 0;
        local_78 = 0;
        uStack_74 = 0;
        uStack_70 = 0x214288;
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    sVar6 = _claim(this);
    _set_hierarchy(this,sVar6,node,uVar11);
    _copy_props_wo_key(this,sVar6,this,node);
    if ((sVar6 == 0xffffffffffffffff) || (this->m_cap <= sVar6)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_88[0] = '\0';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      uStack_80 = 0x4b83;
      uStack_7c = 0;
      local_78 = 0;
      uStack_74 = 0;
      uStack_70 = 0x214288;
      uStack_6c = 0;
      local_68 = 0x65;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    pNVar8 = this->m_buf;
    NVar12 = pNVar8[sVar6].m_type.type | DOC;
    local_60 = lVar10;
    _check_next_flags(this,sVar6,NVar12);
    pNVar8[sVar6].m_type.type = NVar12;
    node_00 = first_child(this,node);
    sVar7 = next_sibling(this,node_00);
    if (node_00 != sVar6 && node_00 != 0xffffffffffffffff) {
      after = 0xffffffffffffffff;
      do {
        node_01 = sVar7;
        move(this,node_00,sVar6,after);
        sVar7 = next_sibling(this,node_01);
        if (node_01 == 0xffffffffffffffff) break;
        after = node_00;
        node_00 = node_01;
      } while (node_01 != sVar6);
    }
    lVar10 = local_60;
    if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      goto LAB_001c8aa9;
    }
  }
  else {
    if (uVar9 <= node || node == 0xffffffffffffffff) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_88[0] = '\0';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      uStack_80 = 0x4b86;
      uStack_7c = 0;
      local_78 = 0;
      uStack_74 = 0;
      uStack_70 = 0x214288;
      uStack_6c = 0;
      local_68 = 0x65;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      uVar9 = this->m_cap;
    }
    pNVar8 = this->m_buf;
    NVar12 = pNVar8[node].m_type.type;
    if (((uint)NVar12 & 3) == 1) {
      if (node == 0xffffffffffffffff || uVar9 <= node) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        uStack_80 = 0x4b83;
        uStack_7c = 0;
        local_78 = 0;
        uStack_74 = 0;
        uStack_70 = 0x214288;
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        pNVar8 = this->m_buf;
        NVar12 = pNVar8[node].m_type.type;
      }
      pNVar8[node].m_type.type = NVar12 | SEQ;
      uVar9 = this->m_cap;
      if (node < uVar9 && node != 0xffffffffffffffff) {
        uVar11 = pNVar8[node].m_last_child;
LAB_001c82da:
        if (uVar9 <= node) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_88[0] = '\0';
          local_88[1] = '\0';
          local_88[2] = '\0';
          local_88[3] = '\0';
          local_88[4] = '\0';
          local_88[5] = '\0';
          local_88[6] = '\0';
          local_88[7] = '\0';
          uStack_80 = 0x4b86;
          uStack_7c = 0;
          local_78 = 0;
          uStack_74 = 0;
          uStack_70 = 0x214288;
          uStack_6c = 0;
          local_68 = 0x65;
          (*(code *)PTR_error_impl_00247a78)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
          pNVar8 = this->m_buf;
        }
        uVar1 = (undefined1)pNVar8[node].m_type.type;
      }
      else {
        if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        uStack_80 = 0x4b83;
        uStack_7c = 0;
        local_78 = 0;
        uStack_74 = 0;
        uStack_70 = 0x214288;
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        pNVar8 = this->m_buf;
        uVar11 = pNVar8[node].m_last_child;
        if (node != 0xffffffffffffffff) {
          uVar9 = this->m_cap;
          goto LAB_001c82da;
        }
        if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        uStack_80 = 0x4cb1;
        uStack_7c = 0;
        local_78 = 0;
        uStack_74 = 0;
        uStack_70 = 0x214288;
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
        if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        uStack_80 = 0x4b86;
        uStack_7c = 0;
        local_78 = 0;
        uStack_74 = 0;
        uStack_70 = 0x214288;
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        uVar1 = (undefined1)this->m_buf[-1].m_type.type;
      }
      if (((uVar1 & (STREAM|MAP)) == NOTYPE) && (bVar5 = is_root(this,node), !bVar5)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        uStack_80 = 0x4cb2;
        uStack_7c = 0;
        local_78 = 0;
        uStack_74 = 0;
        uStack_70 = 0x214288;
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: is_container(parent) || is_root(parent)",0x35,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if (uVar11 != 0xffffffffffffffff) {
        if (this->m_cap <= uVar11) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_88[0] = '\0';
          local_88[1] = '\0';
          local_88[2] = '\0';
          local_88[3] = '\0';
          local_88[4] = '\0';
          local_88[5] = '\0';
          local_88[6] = '\0';
          local_88[7] = '\0';
          uStack_80 = 0x4b83;
          uStack_7c = 0;
          local_78 = 0;
          uStack_74 = 0;
          uStack_70 = 0x214288;
          uStack_6c = 0;
          local_68 = 0x65;
          (*(code *)PTR_error_impl_00247a78)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        if (this->m_buf[uVar11].m_parent != node) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_88[0] = '\0';
          local_88[1] = '\0';
          local_88[2] = '\0';
          local_88[3] = '\0';
          local_88[4] = '\0';
          local_88[5] = '\0';
          local_88[6] = '\0';
          local_88[7] = '\0';
          uStack_80 = 0x4cb3;
          uStack_7c = 0;
          local_78 = 0;
          uStack_74 = 0;
          uStack_70 = 0x214288;
          uStack_6c = 0;
          local_68 = 0x65;
          (*(code *)PTR_error_impl_00247a78)
                    ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                     (anonymous_namespace)::s_default_callbacks);
        }
      }
      sVar6 = _claim(this);
      _set_hierarchy(this,sVar6,node,uVar11);
      _copy_props_wo_key(this,sVar6,this,node);
      if ((sVar6 == 0xffffffffffffffff) || (this->m_cap <= sVar6)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        uStack_80 = 0x4b83;
        uStack_7c = 0;
        local_78 = 0;
        uStack_74 = 0;
        uStack_70 = 0x214288;
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      pNVar8 = this->m_buf;
      NVar12 = pNVar8[sVar6].m_type.type | DOC;
      pNVar8[sVar6].m_type.type = NVar12;
      if ((sVar6 == 0xffffffffffffffff) || (this->m_cap <= sVar6)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        uStack_80 = 0x4b83;
        uStack_7c = 0;
        local_78 = 0;
        uStack_74 = 0;
        uStack_70 = 0x214288;
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        pNVar8 = this->m_buf;
        NVar12 = pNVar8[sVar6].m_type.type;
      }
      pNVar8[sVar6].m_type.type = NVar12 & ~SEQ;
      uVar9 = this->m_cap;
    }
    if ((node != 0xffffffffffffffff) && (node < uVar9)) goto LAB_001c8b0c;
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
LAB_001c8aa9:
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    uStack_80 = 0x4b83;
    uStack_7c = 0;
    local_78 = 0;
    uStack_74 = 0;
    uStack_70 = 0x214288;
    uStack_6c = 0;
    local_68 = 0x65;
    (*(code *)PTR_error_impl_00247a78)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar8 = this->m_buf;
LAB_001c8b0c:
  *(undefined8 *)((long)&(pNVar8->m_type).type + lVar10) = 0x28;
  return;
}

Assistant:

void Tree::set_root_as_stream()
{
    size_t root = root_id();
    if(is_stream(root))
        return;
    // don't use _add_flags() because it's checked and will fail
    if(!has_children(root))
    {
        if(is_val(root))
        {
            _p(root)->m_type.add(SEQ);
            size_t next_doc = append_child(root);
            _copy_props_wo_key(next_doc, root);
            _p(next_doc)->m_type.add(DOC);
            _p(next_doc)->m_type.rem(SEQ);
        }
        _p(root)->m_type = STREAM;
        return;
    }
    _RYML_CB_ASSERT(m_callbacks, !has_key(root));
    size_t next_doc = append_child(root);
    _copy_props_wo_key(next_doc, root);
    _add_flags(next_doc, DOC);
    for(size_t prev = NONE, ch = first_child(root), next = next_sibling(ch); ch != NONE; )
    {
        if(ch == next_doc)
            break;
        move(ch, next_doc, prev);
        prev = ch;
        ch = next;
        next = next_sibling(next);
    }
    _p(root)->m_type = STREAM;
}